

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2167d0::SQLiteBuildDB::getKeysWithResult
          (SQLiteBuildDB *this,
          vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *keys_out,
          vector<llbuild::core::Result,_std::allocator<llbuild::core::Result>_> *results_out,
          string *error_out)

{
  sqlite3_stmt *psVar1;
  NodeKind LHSKind;
  undefined8 __dest;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long lVar6;
  undefined4 extraout_var;
  value_type *pvVar7;
  value_type *pvVar8;
  void *__src;
  pointer pcVar9;
  KeyID KVar10;
  int __oflag;
  ulong unaff_RBX;
  Child LHS;
  uint uVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  pthread_mutex_t *__mutex;
  bool bVar14;
  DBKeyID dbKeyID;
  KeyType key;
  KeyID engineKeyID;
  Result result;
  BinaryDecoder decoder;
  DBKeyID local_160;
  uint local_154;
  value_type local_150;
  pthread_mutex_t *local_130;
  sqlite3_stmt *local_128;
  KeyID local_120;
  undefined1 local_118 [32];
  Epoch local_f8;
  Epoch EStack_f0;
  vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_> local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_d0;
  Timestamp local_b8;
  Timestamp local_b0;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *local_a8;
  vector<llbuild::core::Result,_std::allocator<llbuild::core::Result>_> *local_a0;
  DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  *local_98;
  DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  *local_90;
  ulong local_88;
  string local_80;
  Child local_60 [2];
  undefined2 local_50;
  Child local_48;
  NodeKind local_38;
  char local_37;
  
  if (this->delegate == (BuildDBDelegate *)0x0) {
    __assert_fail("delegate != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x2e4,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::getKeysWithResult(std::vector<KeyType> &, std::vector<Result> &, std::string *)"
                 );
  }
  __mutex = (pthread_mutex_t *)&this->dbMutex;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  iVar2 = open(this,(char *)error_out,__oflag);
  if ((char)iVar2 != '\0') {
    psVar1 = this->getKeysWithResultStmt;
    iVar2 = sqlite3_reset(psVar1);
    if (iVar2 == 0) {
      local_90 = (DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                  *)&this->engineKeyIDs;
      local_98 = (DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                  *)&this->dbKeyIDs;
      local_130 = __mutex;
      local_128 = psVar1;
      local_a8 = keys_out;
      local_a0 = results_out;
      do {
        psVar1 = local_128;
        iVar2 = sqlite3_step(local_128);
        unaff_RBX = CONCAT71((int7)(unaff_RBX >> 8),iVar2 != 100);
        if (iVar2 != 100) break;
        local_154 = (uint)unaff_RBX;
        iVar2 = sqlite3_column_count(psVar1);
        if (iVar2 != 9) {
          __assert_fail("sqlite3_column_count(stmt) == 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                        ,0x2f0,
                        "virtual bool (anonymous namespace)::SQLiteBuildDB::getKeysWithResult(std::vector<KeyType> &, std::vector<Result> &, std::string *)"
                       );
        }
        local_160.value = sqlite3_column_int64(psVar1,0);
        lVar6 = sqlite3_column_text(psVar1,1);
        iVar2 = sqlite3_column_bytes(psVar1,1);
        local_150.key._M_dataplus._M_p = (pointer)&local_150.key.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,lVar6,iVar2 + lVar6);
        iVar2 = (*this->delegate->_vptr_BuildDBDelegate[2])(this->delegate,(string *)&local_150);
        local_120._value = CONCAT44(extraout_var,iVar2);
        pvVar7 = llvm::
                 DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                 ::FindAndConstruct(local_90,&local_160);
        (pvVar7->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value = local_120._value;
        pvVar8 = llvm::
                 DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                 ::FindAndConstruct(local_98,&local_120);
        (pvVar8->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = local_160.value;
        vStack_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_e8.super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8 = 0;
        EStack_f0 = 0;
        local_118._16_8_ = 0;
        local_118._24_8_ = 0;
        local_118._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_118._8_8_ = (pointer)0x0;
        iVar2 = sqlite3_column_bytes(psVar1,2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118,(long)iVar2);
        __dest = local_118._0_8_;
        __src = (void *)sqlite3_column_blob(psVar1,2);
        memcpy((void *)__dest,__src,(long)iVar2);
        EStack_f0 = sqlite3_column_int64(psVar1,3);
        local_f8 = sqlite3_column_int64(psVar1,4);
        local_b8 = (Timestamp)sqlite3_column_double(psVar1,5);
        local_b0 = (Timestamp)sqlite3_column_double(psVar1,6);
        uVar3 = sqlite3_column_bytes(psVar1,7);
        pcVar9 = (pointer)sqlite3_column_blob(psVar1,7);
        if ((uVar3 & 7) != 0) {
          llvm::Twine::Twine((Twine *)&local_48,"unexpected contents for database result: ");
          if (local_38 == EmptyKind) {
            local_50 = 0x10a;
            local_60[0].twine = (Twine *)(local_160.value & 0xffffffff);
          }
          else if (local_38 == NullKind) {
            local_50 = 0x100;
          }
          else {
            LHS.twine = (Twine *)&local_48;
            LHSKind = TwineKind;
            if (local_37 == '\x01') {
              LHS = local_48;
              LHSKind = local_38;
            }
            llvm::Twine::Twine((Twine *)local_60,LHS,LHSKind,(Twine *)(local_160.value & 0xffffffff)
                               ,DecIKind);
          }
          llvm::Twine::str_abi_cxx11_(&local_80,(Twine *)local_60);
          std::__cxx11::string::operator=((string *)error_out,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if (vStack_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_d0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)vStack_d0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_d0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e8.
              super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.
                            super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_e8.
                                  super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_e8.
                                  super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
          }
          _Var13._M_p = local_150.key._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150.key._M_dataplus._M_p == &local_150.key.field_2) goto LAB_0015f60c;
          goto LAB_0015f604;
        }
        uVar11 = (int)uVar3 >> 3;
        std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>::resize
                  (&local_e8,(long)(int)uVar11);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&vStack_d0,(long)(int)uVar11);
        local_80.field_2._M_allocated_capacity = 0;
        bVar14 = uVar3 < 8;
        local_80._M_dataplus._M_p = pcVar9;
        local_80._M_string_length = (long)(int)uVar3;
        if (!bVar14) {
          local_88 = (ulong)uVar11;
          uVar12 = 0;
          do {
            uVar4 = llbuild::basic::BinaryDecoder::read32((BinaryDecoder *)&local_80);
            uVar5 = llbuild::basic::BinaryDecoder::read32((BinaryDecoder *)&local_80);
            KVar10 = getKeyIDForID(this,(DBKeyID)(CONCAT44(uVar5,uVar4) >> 2),error_out);
            if (error_out->_M_string_length != 0) {
              if (vStack_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(vStack_d0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)vStack_d0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)vStack_d0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              __mutex = local_130;
              if (local_e8.
                  super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_e8.
                                super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_e8.
                                      super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_e8.
                                      super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
              }
              _Var13._M_p = local_150.key._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150.key._M_dataplus._M_p != &local_150.key.field_2) goto LAB_0015f604;
              goto LAB_0015f60c;
            }
            local_e8.super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar12]._value = KVar10._value;
            vStack_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12] = (byte)uVar4 & 3;
            uVar12 = uVar12 + 1;
            bVar14 = local_88 == uVar12;
          } while (!bVar14);
        }
        local_118._24_8_ = sqlite3_column_int64(local_128,8);
        std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::push_back
                  (local_a8,&local_150);
        std::vector<llbuild::core::Result,_std::allocator<llbuild::core::Result>_>::push_back
                  (local_a0,(value_type *)local_118);
        if (vStack_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_d0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_d0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_d0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        __mutex = local_130;
        if (local_e8.super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.
                          super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.
                                super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.
                                super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.key._M_dataplus._M_p != &local_150.key.field_2) {
          operator_delete(local_150.key._M_dataplus._M_p,
                          local_150.key.field_2._M_allocated_capacity + 1);
        }
        unaff_RBX = (ulong)local_154;
      } while (bVar14);
      goto LAB_0015f60e;
    }
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
              ((string *)local_118,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)local_118);
    local_150.key.field_2._M_allocated_capacity = local_118._16_8_;
    _Var13._M_p = (pointer)local_118._0_8_;
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
LAB_0015f604:
      operator_delete(_Var13._M_p,local_150.key.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0015f60c:
  unaff_RBX = 0;
LAB_0015f60e:
  pthread_mutex_unlock(__mutex);
  return (bool)(char)unaff_RBX;
}

Assistant:

bool getKeysWithResult(std::vector<KeyType> &keys_out, std::vector<Result> &results_out, std::string* error_out) override {
    
    assert(delegate != nullptr);
    std::lock_guard<std::mutex> guard(dbMutex);
    
    if (!open(error_out))
      return false;
    
    auto stmt = getKeysWithResultStmt;
    
    int result = sqlite3_reset(stmt);
    checkSQLiteResultOKReturnFalse(result);
    
    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 9);
      
      auto dbKeyID = DBKeyID(sqlite3_column_int64(stmt, 0));
      auto key = KeyType((const char *)sqlite3_column_text(stmt, 1), sqlite3_column_bytes(stmt, 1));
      
      auto engineKeyID = delegate->getKeyID(key);
      engineKeyIDs[dbKeyID] = engineKeyID;
      dbKeyIDs[engineKeyID] = dbKeyID;
      
      Result result;
      int numValueBytes = sqlite3_column_bytes(stmt, 2);
      result.value.resize(numValueBytes);
      memcpy(result.value.data(),
             sqlite3_column_blob(stmt, 2),
             numValueBytes);
      result.builtAt = sqlite3_column_int64(stmt, 3);
      result.computedAt = sqlite3_column_int64(stmt, 4);
      result.start = sqlite3_column_double(stmt, 5);
      result.end = sqlite3_column_double(stmt, 6);
      auto numDependencyBytes = sqlite3_column_bytes(stmt, 7);
      auto dependencyBytes = sqlite3_column_blob(stmt, 7);
      
      // map dependencies
      int numDependencies = numDependencyBytes / sizeof(uint64_t);
      if (numDependencyBytes != static_cast<int>(numDependencies * sizeof(uint64_t))) {
        *error_out = (llvm::Twine("unexpected contents for database result: ") +
                      llvm::Twine((int)dbKeyID.value)).str();
        return false;
      }

      result.dependencies.resize(numDependencies);
      basic::BinaryDecoder decoder(
                                   StringRef((const char*)dependencyBytes, numDependencyBytes));
      for (auto i = 0; i != numDependencies; ++i) {
        uint64_t raw;
        decoder.read(raw);
        bool orderOnly = raw & 1;
        bool singleUse = (raw >> 1) & 1;
        DBKeyID dbKeyID(raw >> 2);
        
        // Map the database key ID into an engine key ID (note that we already
        // hold the dbMutex at this point as required by getKeyIDforID())
        KeyID keyID = getKeyIDForID(dbKeyID, error_out);
        if (!error_out->empty()) {
          return false;
        }
        result.dependencies.set(i, keyID, orderOnly, singleUse);
      }
      
      result.signature = basic::CommandSignature(sqlite3_column_int64(stmt, 8));
      
      keys_out.push_back(key);
      results_out.push_back(result);
    }
    
    return true;
  }